

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O1

string * __thiscall
leveldb::InternalKey::DebugString_abi_cxx11_(string *__return_storage_ptr__,InternalKey *this)

{
  ulong uVar1;
  Slice *value;
  ParsedInternalKey parsed;
  ostringstream ss;
  ParsedInternalKey local_1e0;
  string local_1c0;
  pointer local_1a0;
  size_type local_198;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  local_1e0.user_key.data_ = "";
  local_1e0.user_key.size_ = 0;
  uVar1 = (this->rep_)._M_string_length;
  if (7 < uVar1) {
    local_1e0.user_key.data_ = (this->rep_)._M_dataplus._M_p;
    local_1e0.type = (ValueType)*(ulong *)(local_1e0.user_key.data_ + (uVar1 - 8)) & 0xff;
    local_1e0.sequence = *(ulong *)(local_1e0.user_key.data_ + (uVar1 - 8)) >> 8;
    local_1e0.user_key.size_ = uVar1 - 8;
    if (local_1e0.type < 2) {
      ParsedInternalKey::DebugString_abi_cxx11_(__return_storage_ptr__,&local_1e0);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"(bad)",5);
  local_1a0 = (this->rep_)._M_dataplus._M_p;
  local_198 = (this->rep_)._M_string_length;
  EscapeString_abi_cxx11_(&local_1c0,(leveldb *)&local_1a0,value);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string InternalKey::DebugString() const {
  ParsedInternalKey parsed;
  if (ParseInternalKey(rep_, &parsed)) {
    return parsed.DebugString();
  }
  std::ostringstream ss;
  ss << "(bad)" << EscapeString(rep_);
  return ss.str();
}